

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O3

void CityHashCrc256Long(char *s,size_t len,uint32 seed,uint64 *result)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  uint64 old_a;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint64 uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  long lVar16;
  uint64 uVar17;
  ulong uVar18;
  undefined8 uVar19;
  long lVar20;
  undefined8 uVar21;
  ulong uVar22;
  undefined8 uVar23;
  long lVar24;
  
  uVar7 = (ulong)seed;
  lVar24 = 0;
  lVar16 = 0;
  lVar20 = 0;
  uVar6 = *(long *)(s + 0x60) + 0xc3a5c85c97cb3127;
  uVar8 = *(long *)(s + 0x38) + 0xc3a5c85c97cb3127;
  uVar9 = (uVar6 ^ len) * -0x622015f714c7d297;
  uVar9 = (uVar9 >> 0x2f ^ len ^ uVar9) * -0x622015f714c7d297;
  uVar17 = (uVar9 >> 0x2f ^ uVar9) * -0x622015f714c7d297;
  *result = uVar17;
  uVar12 = *(long *)(s + 0x78) * -0x3c5a37a36834ced9 + len;
  result[1] = uVar12;
  uVar9 = uVar17 + uVar12;
  uVar4 = len / 0xf0;
  uVar13 = *(long *)(s + 0xb8) + uVar7;
  lVar1 = uVar4 * 0xf0;
  lVar3 = 0;
  plVar5 = (long *)s;
  uVar11 = uVar12;
  uVar10 = uVar17;
  do {
    uVar18 = (uVar10 >> 0x1a | uVar10 << 0x26) + plVar5[1];
    uVar10 = (uVar9 >> 0x18 | uVar9 << 0x28) + plVar5[4];
    uVar14 = (uVar13 >> 0x20 | uVar13 << 0x20) + plVar5[3];
    uVar13 = (uVar11 >> 0x28 | uVar11 << 0x18) + plVar5[2];
    uVar9 = (uVar6 >> 0x28 | uVar6 << 0x18) + *plVar5;
    uVar2 = crc32(lVar3,uVar18);
    uVar19 = crc32(lVar20,uVar10);
    uVar15 = crc32(lVar16,uVar14);
    uVar23 = crc32(lVar24,uVar13);
    uVar21 = crc32(uVar7,uVar9);
    uVar7 = (uVar9 >> 0x18 | uVar9 << 0x28) + plVar5[0xe];
    uVar11 = (uVar10 >> 0x21 | uVar10 * 0x80000000) * -0x3c5a37a36834ced9 + plVar5[8];
    uVar10 = (uVar8 >> 0x19 | uVar8 << 0x27) * -0x3c5a37a36834ced9 + plVar5[9];
    uVar6 = (uVar14 >> 0x29 | uVar14 * 0x800000) * -0x3c5a37a36834ced9 + plVar5[7];
    uVar9 = (uVar18 >> 0x29 | uVar18 * 0x800000) * -0x3c5a37a36834ced9 + plVar5[5];
    uVar8 = (uVar13 >> 0x1b | uVar13 << 0x25) * -0x3c5a37a36834ced9 + plVar5[6];
    uVar19 = crc32(uVar19,uVar10);
    uVar15 = crc32(uVar15,uVar11);
    uVar14 = (uVar10 >> 0x20 | uVar10 << 0x20) + plVar5[0xd];
    uVar13 = (uVar11 >> 0x28 | uVar11 * 0x1000000) + plVar5[0xc];
    uVar23 = crc32(uVar23,uVar6);
    uVar10 = (uVar6 >> 0x1a | uVar6 << 0x26) + plVar5[0xb];
    uVar2 = crc32(uVar2,uVar8);
    uVar8 = (uVar8 >> 0x28 | uVar8 * 0x1000000) + plVar5[10];
    uVar21 = crc32(uVar21,uVar9);
    uVar11 = (uVar9 >> 0x19 | uVar9 << 0x27) * -0x3c5a37a36834ced9 + plVar5[0x13];
    uVar19 = crc32(uVar19,uVar7);
    uVar9 = (uVar7 >> 0x21 | uVar7 * 0x80000000) * -0x3c5a37a36834ced9 + plVar5[0x12];
    uVar15 = crc32(uVar15,uVar14);
    uVar23 = crc32(uVar23,uVar13);
    uVar2 = crc32(uVar2,uVar10);
    uVar21 = crc32(uVar21,uVar8);
    uVar6 = (uVar8 >> 0x18 | uVar8 << 0x28) + plVar5[0x18];
    uVar7 = (uVar13 >> 0x1b | uVar13 << 0x25) * -0x3c5a37a36834ced9 + plVar5[0x10];
    uVar14 = (uVar14 >> 0x29 | uVar14 * 0x800000) * -0x3c5a37a36834ced9 + plVar5[0x11];
    uVar13 = (uVar10 >> 0x29 | uVar10 * 0x800000) * -0x3c5a37a36834ced9 + plVar5[0xf];
    uVar18 = (uVar11 >> 0x20 | uVar11 << 0x20) + plVar5[0x17];
    uVar19 = crc32(uVar19,uVar11);
    uVar15 = crc32(uVar15,uVar9);
    uVar19 = crc32(uVar19,uVar6);
    uVar2 = crc32(uVar2,uVar7);
    uVar8 = (uVar14 >> 0x1a | uVar14 << 0x26) + plVar5[0x15];
    uVar23 = crc32(uVar23,uVar14);
    uVar10 = (uVar9 >> 0x28 | uVar9 * 0x1000000) + plVar5[0x16];
    uVar9 = (uVar7 >> 0x28 | uVar7 * 0x1000000) + plVar5[0x14];
    uVar21 = crc32(uVar21,uVar13);
    uVar15 = crc32(uVar15,uVar18);
    uVar23 = crc32(uVar23,uVar10);
    uVar11 = (uVar6 >> 0x21 | uVar6 * 0x80000000) * -0x3c5a37a36834ced9 + plVar5[0x1c];
    uVar13 = (uVar13 >> 0x19 | uVar13 << 0x27) * -0x3c5a37a36834ced9 + plVar5[0x1d];
    uVar21 = crc32(uVar21,uVar9);
    uVar2 = crc32(uVar2,uVar8);
    uVar8 = (uVar8 >> 0x29 | uVar8 * 0x800000) * -0x3c5a37a36834ced9 + plVar5[0x19];
    uVar6 = (uVar10 >> 0x1b | uVar10 << 0x25) * -0x3c5a37a36834ced9 + plVar5[0x1a];
    uVar10 = (uVar18 >> 0x29 | uVar18 * 0x800000) * -0x3c5a37a36834ced9 + plVar5[0x1b];
    plVar5 = plVar5 + 0x1e;
    lVar16 = crc32(uVar15,uVar11);
    lVar20 = crc32(uVar19,uVar13);
    uVar7 = crc32(uVar21,uVar8);
    lVar3 = crc32(uVar2,uVar6);
    lVar24 = crc32(uVar23,uVar10);
    uVar4 = uVar4 - 1;
  } while (uVar4 != 0);
  uVar4 = len % 0xf0;
  plVar5 = (long *)(s + lVar1);
  while (0x27 < uVar4) {
    uVar4 = uVar4 - 0x28;
    uVar14 = (uVar6 >> 0x29 | uVar6 << 0x17) * -0x3c5a37a36834ced9 + *plVar5;
    uVar6 = (uVar10 >> 0x1b | uVar10 << 0x25) * -0x3c5a37a36834ced9 + plVar5[1];
    uVar10 = (uVar11 >> 0x29 | uVar11 << 0x17) * -0x3c5a37a36834ced9 + plVar5[2];
    uVar11 = (uVar13 >> 0x21 | uVar13 << 0x1f) * -0x3c5a37a36834ced9 + plVar5[3];
    uVar13 = (uVar9 >> 0x19 | uVar9 << 0x27) * -0x3c5a37a36834ced9 + plVar5[4];
    plVar5 = plVar5 + 5;
    uVar7 = crc32(uVar7,uVar14);
    lVar3 = crc32(lVar3,uVar6);
    lVar24 = crc32(lVar24,uVar10);
    lVar16 = crc32(lVar16,uVar11);
    lVar20 = crc32(lVar20,uVar13);
    uVar9 = uVar8;
    uVar8 = uVar14;
  }
  uVar14 = uVar8;
  if (uVar4 != 0) {
    uVar14 = (uVar6 >> 0x29 | uVar6 << 0x17) * -0x3c5a37a36834ced9 +
             *(long *)((long)plVar5 + (uVar4 - 0x28));
    uVar6 = (uVar10 >> 0x1b | uVar10 << 0x25) * -0x3c5a37a36834ced9 +
            *(long *)((long)plVar5 + (uVar4 - 0x20));
    uVar10 = (uVar11 >> 0x29 | uVar11 << 0x17) * -0x3c5a37a36834ced9 +
             *(long *)((long)plVar5 + (uVar4 - 0x18));
    uVar11 = (uVar13 >> 0x21 | uVar13 << 0x1f) * -0x3c5a37a36834ced9 +
             *(long *)((long)plVar5 + (uVar4 - 0x10));
    uVar13 = (uVar9 >> 0x19 | uVar9 << 0x27) * -0x3c5a37a36834ced9 +
             *(long *)((long)plVar5 + (uVar4 - 8));
    uVar7 = crc32(uVar7,uVar14);
    lVar3 = crc32(lVar3,uVar6);
    lVar24 = crc32(lVar24,uVar10);
    lVar16 = crc32(lVar16,uVar11);
    lVar20 = crc32(lVar20,uVar13);
    uVar9 = uVar8;
  }
  uVar18 = (uVar10 ^ uVar7) * -0x622015f714c7d297;
  uVar10 = (lVar16 << 0x20) + lVar20;
  uVar8 = (lVar3 << 0x20) + lVar24;
  uVar4 = (uVar14 ^ uVar10) * -0x622015f714c7d297;
  uVar7 = (uVar18 >> 0x2f ^ uVar7 ^ uVar18) * -0x622015f714c7d297;
  uVar4 = (uVar4 >> 0x2f ^ uVar10 ^ uVar4) * -0x622015f714c7d297;
  uVar4 = uVar4 >> 0x2f ^ uVar4;
  uVar7 = (uVar7 >> 0x2f ^ uVar7) * -0x622015f714c7d297 + lVar16;
  uVar22 = (uVar7 ^ uVar6 + uVar8) * -0x622015f714c7d297;
  uVar11 = (uVar11 ^ uVar17 + uVar13) * -0x622015f714c7d297;
  uVar11 = (uVar11 >> 0x2f ^ uVar17 + uVar13 ^ uVar11) * -0x622015f714c7d297;
  uVar14 = (uVar9 ^ uVar8) * -0x622015f714c7d297;
  uVar18 = (uVar11 >> 0x2f ^ uVar11) * -0x622015f714c7d297;
  uVar9 = (uVar14 >> 0x2f ^ uVar9 ^ uVar14) * -0x622015f714c7d297;
  uVar22 = (uVar22 >> 0x2f ^ uVar7 ^ uVar22) * -0x622015f714c7d297;
  uVar11 = (uVar9 >> 0x2f ^ uVar9) * -0x622015f714c7d297 + lVar16;
  uVar14 = uVar4 * -0x622015f714c7d297;
  uVar9 = (uVar14 ^ uVar18) * -0x622015f714c7d297;
  uVar9 = (uVar9 >> 0x2f ^ uVar18 ^ uVar9) * -0x622015f714c7d297;
  lVar20 = (uVar9 >> 0x2f ^ uVar9) * -0x622015f714c7d297 + uVar10 + uVar13;
  uVar9 = (uVar10 + uVar13 ^ uVar11) * -0x622015f714c7d297;
  uVar9 = (uVar9 >> 0x2f ^ uVar11 ^ uVar9) * -0x622015f714c7d297;
  lVar16 = (uVar9 >> 0x2f ^ uVar9) * -0x622015f714c7d297 + uVar7;
  uVar17 = ((uVar22 >> 0x2f ^ uVar22) + uVar4) * -0x622015f714c7d297 + uVar8 + lVar20 + lVar16;
  uVar9 = (lVar16 + uVar14) * -0x3c5a37a36834ced9;
  lVar16 = (uVar9 >> 0x2f ^ uVar9) * -0x3c5a37a36834ced9 + uVar6 + uVar8;
  uVar12 = uVar12 + uVar17 + lVar16;
  uVar9 = lVar16 * -0x3c5a37a36834ced9;
  *result = uVar17;
  result[1] = uVar12;
  lVar16 = (uVar9 >> 0x2f ^ uVar9) * -0x3c5a37a36834ced9 + uVar7;
  uVar12 = uVar12 + lVar16;
  uVar9 = (lVar16 + lVar20) * -0x3c5a37a36834ced9;
  result[2] = uVar12;
  result[3] = (uVar9 >> 0x2f ^ uVar9) * -0x3c5a37a36834ced9 + uVar12;
  return;
}

Assistant:

static void CityHashCrc256Long(const char *s, size_t len,
                               uint32 seed, uint64 *result) {
  uint64 a = Fetch64(s + 56) + k0;
  uint64 b = Fetch64(s + 96) + k0;
  uint64 c = result[0] = HashLen16(b, len);
  uint64 d = result[1] = Fetch64(s + 120) * k0 + len;
  uint64 e = Fetch64(s + 184) + seed;
  uint64 f = seed;
  uint64 g = 0;
  uint64 h = 0;
  uint64 i = 0;
  uint64 j = 0;
  uint64 t = c + d;

  // 240 bytes of input per iter.
  size_t iters = len / 240;
  len -= iters * 240;
  do {
#define CHUNK(multiplier, z)                                    \
    {                                                           \
      uint64 old_a = a;                                         \
      a = Rotate(b, 41 ^ z) * multiplier + Fetch64(s);          \
      b = Rotate(c, 27 ^ z) * multiplier + Fetch64(s + 8);      \
      c = Rotate(d, 41 ^ z) * multiplier + Fetch64(s + 16);     \
      d = Rotate(e, 33 ^ z) * multiplier + Fetch64(s + 24);     \
      e = Rotate(t, 25 ^ z) * multiplier + Fetch64(s + 32);     \
      t = old_a;                                                \
    }                                                           \
    f = _mm_crc32_u64(f, a);                                    \
    g = _mm_crc32_u64(g, b);                                    \
    h = _mm_crc32_u64(h, c);                                    \
    i = _mm_crc32_u64(i, d);                                    \
    j = _mm_crc32_u64(j, e);                                    \
    s += 40

    CHUNK(1, 1); CHUNK(k0, 0);
    CHUNK(1, 1); CHUNK(k0, 0);
    CHUNK(1, 1); CHUNK(k0, 0);
  } while (--iters > 0);

  while (len >= 40) {
    CHUNK(k0, 0);
    len -= 40;
  }
  if (len > 0) {
    s = s + len - 40;
    CHUNK(k0, 0);
  }
  j += i << 32;
  a = HashLen16(a, j);
  h += g << 32;
  b += h;
  c = HashLen16(c, f) + i;
  d = HashLen16(d, e + result[0]);
  j += e;
  i += HashLen16(h, t);
  e = HashLen16(a, d) + j;
  f = HashLen16(b, c) + a;
  g = HashLen16(j, i) + c;
  result[0] = e + f + g + h;
  a = ShiftMix((a + g) * k0) * k0 + b;
  result[1] += a + result[0];
  a = ShiftMix(a * k0) * k0 + c;
  result[2] = a + result[1];
  a = ShiftMix((a + e) * k0) * k0;
  result[3] = a + result[2];
}